

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetPointer(Mem *pMem,void *pPtr,char *zPType,_func_void_void_ptr *xDestructor)

{
  _func_void_void_ptr *local_38;
  char *local_30;
  _func_void_void_ptr *xDestructor_local;
  char *zPType_local;
  void *pPtr_local;
  Mem *pMem_local;
  
  local_30 = zPType;
  if (zPType == (char *)0x0) {
    local_30 = "";
  }
  (pMem->u).zPType = local_30;
  pMem->z = (char *)pPtr;
  pMem->flags = 0x8601;
  pMem->eSubtype = 'p';
  local_38 = xDestructor;
  if (xDestructor == (_func_void_void_ptr *)0x0) {
    local_38 = sqlite3NoopDestructor;
  }
  pMem->xDel = local_38;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetPointer(
  Mem *pMem,
  void *pPtr,
  const char *zPType,
  void (*xDestructor)(void*)
){
  assert( pMem->flags==MEM_Null );
  pMem->u.zPType = zPType ? zPType : "";
  pMem->z = pPtr;
  pMem->flags = MEM_Null|MEM_Dyn|MEM_Subtype|MEM_Term;
  pMem->eSubtype = 'p';
  pMem->xDel = xDestructor ? xDestructor : sqlite3NoopDestructor;
}